

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

JavascriptEnumerator * __thiscall
Js::TypedArrayBase::GetIndexEnumerator
          (TypedArrayBase *this,EnumeratorFlags flags,ScriptContext *requestContext)

{
  Recycler *pRVar1;
  TypedArrayIndexEnumerator *this_00;
  TrackAllocData local_48;
  ScriptContext *local_20;
  ScriptContext *requestContext_local;
  TypedArrayBase *pTStack_10;
  EnumeratorFlags flags_local;
  TypedArrayBase *this_local;
  
  local_20 = requestContext;
  requestContext_local._7_1_ = flags;
  pTStack_10 = this;
  pRVar1 = ScriptContext::GetRecycler(requestContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&TypedArrayIndexEnumerator::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
             ,0x299);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  this_00 = (TypedArrayIndexEnumerator *)new<Memory::Recycler>(0x20,pRVar1,0x43c4b0);
  TypedArrayIndexEnumerator::TypedArrayIndexEnumerator
            (this_00,this,requestContext_local._7_1_,local_20);
  return &this_00->super_JavascriptEnumerator;
}

Assistant:

JavascriptEnumerator * TypedArrayBase::GetIndexEnumerator(EnumeratorFlags flags, ScriptContext * requestContext)
    {
        return RecyclerNew(requestContext->GetRecycler(), TypedArrayIndexEnumerator, this, flags, requestContext);
    }